

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intermediate.cpp
# Opt level: O3

TIntermTyped * __thiscall
glslang::TIntermediate::addConversion
          (TIntermediate *this,TOperator op,TType *type,TIntermTyped *node)

{
  byte bVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  TBasicType to;
  int iVar5;
  TBasicType TVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  ulong uVar7;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  TIntermTyped *pTVar8;
  
  bVar2 = isConversionAllowed(this,op,node);
  if (!bVar2) {
    return (TIntermTyped *)0x0;
  }
  iVar4 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])(node);
  bVar2 = TType::operator==(type,(TType *)CONCAT44(extraout_var,iVar4));
  if (bVar2) {
    return node;
  }
  iVar4 = (*type->_vptr_TType[0x25])(type);
  if ((char)iVar4 != '\0') {
    return (TIntermTyped *)0x0;
  }
  iVar4 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x2d])(node);
  if ((char)iVar4 != '\0') {
    return (TIntermTyped *)0x0;
  }
  iVar4 = (*type->_vptr_TType[0x1d])(type);
  if ((char)iVar4 != '\0') {
    return (TIntermTyped *)0x0;
  }
  iVar4 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])(node);
  cVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar4) + 0xe8))
                    ((long *)CONCAT44(extraout_var_00,iVar4));
  if (cVar3 != '\0') {
    return (TIntermTyped *)0x0;
  }
  iVar4 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])(node);
  if ((op - EOpConstructCooperativeVectorNV < 0xfffffffe) &&
     ((*(uint *)(CONCAT44(extraout_var_01,iVar4) + 8) & 0x600000) != 0)) {
    return (TIntermTyped *)0x0;
  }
  iVar4 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])(node);
  iVar4 = (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar4) + 0x38))
                    ((long *)CONCAT44(extraout_var_02,iVar4));
  if (iVar4 == 0x17) {
    return (TIntermTyped *)0x0;
  }
  iVar4 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])(node);
  iVar4 = (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar4) + 0x38))
                    ((long *)CONCAT44(extraout_var_03,iVar4));
  if (iVar4 == 0x18) {
    return (TIntermTyped *)0x0;
  }
  iVar4 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])(node);
  if ((op != EOpConstructCooperativeVectorNV) &&
     ((*(uint *)(CONCAT44(extraout_var_04,iVar4) + 8) & 0x8000000) != 0)) {
    return (TIntermTyped *)0x0;
  }
  if ((int)op < 0x16a) {
    if ((((0x3f < op - EOpModf) ||
         ((0xee00000000000e7fU >> ((ulong)(op - EOpModf) & 0x3f) & 1) == 0)) &&
        ((0x3f < op - EOpSequence ||
         ((0x8000000010000109U >> ((ulong)(op - EOpSequence) & 0x3f) & 1) == 0)))) && (op != EOpPow)
       ) goto switchD_0040ce31_caseD_16b;
    goto switchD_0040ce31_caseD_16a;
  }
  if (0x1c8 < (int)op) {
    uVar7 = (ulong)(op - EOpConstructFloat16);
    if (op - EOpConstructFloat16 < 0x25) {
      if ((0x7dbce2000U >> (uVar7 & 0x3f) & 1) != 0) goto switchD_0040ce31_caseD_16a;
      if ((0x1800000000U >> (uVar7 & 0x3f) & 1) != 0) {
        if (this->source != EShSourceHlsl) {
LAB_0040cd3e:
          iVar4 = (*type->_vptr_TType[7])(type);
          if (((iVar4 - 4U & 0xfffffff9) != 0) && ((iVar4 - 5U & 0xfffffff9) != 0)) {
            return (TIntermTyped *)0x0;
          }
          iVar4 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x20])(node);
          if ((iVar4 - 4U & 0xfffffff9) == 0) {
            return node;
          }
          if ((iVar4 - 5U & 0xfffffff9) != 0) {
            return (TIntermTyped *)0x0;
          }
          return node;
        }
        iVar4 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])(node);
        iVar4 = (**(code **)(*(long *)CONCAT44(extraout_var_05,iVar4) + 0x38))
                          ((long *)CONCAT44(extraout_var_05,iVar4));
        if (iVar4 != 0xc) goto LAB_0040cd3e;
        goto LAB_0040ce89;
      }
      if (uVar7 != 0) goto LAB_0040ced2;
    }
    else {
LAB_0040ced2:
      if ((op != EOpLit) && (op != EOpDst)) {
switchD_0040ce31_caseD_16b:
        iVar4 = (*type->_vptr_TType[7])(type);
        iVar5 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])(node);
        iVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_09,iVar5) + 0x38))
                          ((long *)CONCAT44(extraout_var_09,iVar5));
        if (iVar4 != iVar5) {
          return (TIntermTyped *)0x0;
        }
        return node;
      }
switchD_0040ce31_caseD_16a:
      iVar4 = (*type->_vptr_TType[7])(type);
      if (iVar4 == 0x12) {
LAB_0040cdee:
        iVar4 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])(node);
        bVar2 = TType::operator==(type,(TType *)CONCAT44(extraout_var_07,iVar4));
        if (!bVar2) {
          return (TIntermTyped *)0x0;
        }
        return node;
      }
      iVar4 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])(node);
      iVar4 = (**(code **)(*(long *)CONCAT44(extraout_var_06,iVar4) + 0x38))
                        ((long *)CONCAT44(extraout_var_06,iVar4));
      if (iVar4 == 0x12) goto LAB_0040cdee;
      iVar4 = (*type->_vptr_TType[7])(type);
      iVar5 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])(node);
      iVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_08,iVar5) + 0x38))
                        ((long *)CONCAT44(extraout_var_08,iVar5));
      if (iVar4 == iVar5) {
        return node;
      }
      TVar6 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x20])(node);
      to = (*type->_vptr_TType[7])(type);
      bVar2 = canImplicitlyPromote(this,TVar6,to,op);
      if (!bVar2) {
        return (TIntermTyped *)0x0;
      }
LAB_0040ce89:
      if (op - EOpConstructInt8 < 2) goto switchD_0040ce31_caseD_172;
      if (op - EOpConstructInt16 < 2) goto switchD_0040ce31_caseD_174;
      if (op != EOpConstructFloat16) goto switchD_0040ce31_caseD_170;
    }
    bVar1 = (byte)(this->numericFeatures).features & 0x21;
    goto joined_r0x0040ceab;
  }
  switch(op) {
  case EOpReturn:
    goto switchD_0040ce31_caseD_16a;
  default:
    goto switchD_0040ce31_caseD_16b;
  case EOpConstructInt:
  case EOpConstructUint:
  case EOpConstructInt64:
  case EOpConstructUint64:
  case EOpConstructBool:
  case EOpConstructFloat:
  case EOpConstructDouble:
    goto switchD_0040ce31_caseD_170;
  case EOpConstructInt8:
  case EOpConstructUint8:
switchD_0040ce31_caseD_172:
    bVar1 = (byte)(this->numericFeatures).features & 3;
    break;
  case EOpConstructInt16:
  case EOpConstructUint16:
switchD_0040ce31_caseD_174:
    bVar1 = (byte)(this->numericFeatures).features & 5;
  }
joined_r0x0040ceab:
  if (bVar1 != 0) {
switchD_0040ce31_caseD_170:
    iVar4 = (*(node->super_TIntermNode)._vptr_TIntermNode[5])(node);
    if (CONCAT44(extraout_var_10,iVar4) != 0) {
      TVar6 = (*type->_vptr_TType[7])(type);
      iVar4 = (*(node->super_TIntermNode)._vptr_TIntermNode[5])(node);
      pTVar8 = promoteConstantUnion
                         (this,TVar6,(TIntermConstantUnion *)CONCAT44(extraout_var_11,iVar4));
      return pTVar8;
    }
  }
  TVar6 = (*type->_vptr_TType[7])(type);
  pTVar8 = createConversion(this,TVar6,node);
  return pTVar8;
}

Assistant:

TIntermTyped* TIntermediate::addConversion(TOperator op, const TType& type, TIntermTyped* node)
{
    if (!isConversionAllowed(op, node))
        return nullptr;

    // Otherwise, if types are identical, no problem
    if (type == node->getType())
        return node;

    // If one's a structure, then no conversions.
    if (type.isStruct() || node->isStruct())
        return nullptr;

    // If one's an array, then no conversions.
    if (type.isArray() || node->getType().isArray())
        return nullptr;

    // Reject implicit conversions to cooperative matrix types
    if (node->getType().isCoopMat() &&
        op != EOpConstructCooperativeMatrixNV &&
        op != EOpConstructCooperativeMatrixKHR)
        return nullptr;

    if (node->getType().isTensorLayoutNV() ||
        node->getType().isTensorViewNV())
        return nullptr;

    // Reject implicit conversions to cooperative vector types
    if (node->getType().isCoopVecNV() &&
        op != EOpConstructCooperativeVectorNV)
        return nullptr;

    // Note: callers are responsible for other aspects of shape,
    // like vector and matrix sizes.

    switch (op) {
    //
    // Explicit conversions (unary operations)
    //
    case EOpConstructBool:
    case EOpConstructFloat:
    case EOpConstructInt:
    case EOpConstructUint:
    case EOpConstructDouble:
    case EOpConstructFloat16:
    case EOpConstructInt8:
    case EOpConstructUint8:
    case EOpConstructInt16:
    case EOpConstructUint16:
    case EOpConstructInt64:
    case EOpConstructUint64:
        break;

    //
    // Implicit conversions
    //
    case EOpLogicalNot:

    case EOpFunctionCall:

    case EOpReturn:
    case EOpAssign:
    case EOpAddAssign:
    case EOpSubAssign:
    case EOpMulAssign:
    case EOpVectorTimesScalarAssign:
    case EOpMatrixTimesScalarAssign:
    case EOpDivAssign:
    case EOpModAssign:
    case EOpAndAssign:
    case EOpInclusiveOrAssign:
    case EOpExclusiveOrAssign:

    case EOpAtan:
    case EOpClamp:
    case EOpCross:
    case EOpDistance:
    case EOpDot:
    case EOpDst:
    case EOpFaceForward:
    case EOpFma:
    case EOpFrexp:
    case EOpLdexp:
    case EOpMix:
    case EOpLit:
    case EOpMax:
    case EOpMin:
    case EOpMod:
    case EOpModf:
    case EOpPow:
    case EOpReflect:
    case EOpRefract:
    case EOpSmoothStep:
    case EOpStep:

    case EOpSequence:
    case EOpConstructStruct:
    case EOpConstructCooperativeMatrixNV:
    case EOpConstructCooperativeMatrixKHR:
    case EOpConstructCooperativeVectorNV:

        if (type.isReference() || node->getType().isReference()) {
            // types must match to assign a reference
            if (type == node->getType())
                return node;
            else
                return nullptr;
        }

        if (type.getBasicType() == node->getType().getBasicType())
            return node;

        if (! canImplicitlyPromote(node->getBasicType(), type.getBasicType(), op))
            return nullptr;
        break;

    // For GLSL, there are no conversions needed; the shift amount just needs to be an
    // integer type, as do the base/result.
    // HLSL can convert the shift from a bool to an int.
    case EOpLeftShiftAssign:
    case EOpRightShiftAssign:
    {
        if (!(getSource() == EShSourceHlsl && node->getType().getBasicType() == EbtBool)) {
            if (isTypeInt(type.getBasicType()) && isTypeInt(node->getBasicType()))
                return node;
            else
                return nullptr;
        }
        break;
    }

    default:
        // default is to require a match; all exceptions should have case statements above

        if (type.getBasicType() == node->getType().getBasicType())
            return node;
        else
            return nullptr;
    }

    bool canPromoteConstant = true;
    // GL_EXT_shader_16bit_storage can't do OpConstantComposite with
    // 16-bit types, so disable promotion for those types.
    // Many issues with this, from JohnK:
    //  - this isn't really right to discuss SPIR-V here
    //  - this could easily be entirely about scalars, so is overstepping
    //  - we should be looking at what the shader asked for, and saying whether or
    //    not it can be done, in the parser, by calling requireExtensions(), not
    //    changing language sementics on the fly by asking what extensions are in use
    //  - at the time of this writing (14-Aug-2020), no test results are changed by this.
    switch (op) {
    case EOpConstructFloat16:
        canPromoteConstant = numericFeatures.contains(TNumericFeatures::shader_explicit_arithmetic_types) ||
                             numericFeatures.contains(TNumericFeatures::shader_explicit_arithmetic_types_float16);
        break;
    case EOpConstructInt8:
    case EOpConstructUint8:
        canPromoteConstant = numericFeatures.contains(TNumericFeatures::shader_explicit_arithmetic_types) ||
                             numericFeatures.contains(TNumericFeatures::shader_explicit_arithmetic_types_int8);
        break;
    case EOpConstructInt16:
    case EOpConstructUint16:
        canPromoteConstant = numericFeatures.contains(TNumericFeatures::shader_explicit_arithmetic_types) ||
                             numericFeatures.contains(TNumericFeatures::shader_explicit_arithmetic_types_int16);
        break;
    default:
        break;
    }

    if (canPromoteConstant && node->getAsConstantUnion())
        return promoteConstantUnion(type.getBasicType(), node->getAsConstantUnion());

    //
    // Add a new newNode for the conversion.
    //
    TIntermTyped* newNode = createConversion(type.getBasicType(), node);

    return newNode;
}